

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.h
# Opt level: O2

char * QTest::Internal::genericToString<QModelIndex>(void *arg)

{
  char *pcVar1;
  
  pcVar1 = toString<QModelIndex>((QModelIndex *)arg);
  return pcVar1;
}

Assistant:

const char *genericToString(const void *arg)
    {
        using QTest::toString;
        return toString(*static_cast<const T1 *>(arg));
    }